

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O1

void __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
::DynamicFileManager
          (DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
           *this,string *filepath,uint cache_size)

{
  pointer pcVar1;
  long *local_50 [2];
  long local_40 [2];
  
  (this->
  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  )._vptr_FileManager_Base = (_func_int **)&PTR___cxa_pure_virtual_00123ad0;
  std::fstream::fstream
            (&(this->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              ).file);
  (this->
  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  )._vptr_FileManager_Base = (_func_int **)&PTR_init_00123a68;
  (this->
  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  ).cache = (LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
             *)0x0;
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + filepath->_M_string_length);
  (**(this->
     super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
     )._vptr_FileManager_Base)(this,local_50,(ulong)cache_size,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

DynamicFileManager(std::string filepath , unsigned int cache_size) {cache = nullptr , init(filepath , cache_size);}